

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlElement.cpp
# Opt level: O1

void __thiscall libebml::EbmlElement::EbmlElement(EbmlElement *this,EbmlElement *ElementToClone)

{
  this->_vptr_EbmlElement = (_func_int **)&PTR__EbmlElement_001cd4c8;
  this->Size = ElementToClone->Size;
  this->DefaultSize = ElementToClone->DefaultSize;
  this->SizeLength = ElementToClone->SizeLength;
  this->bSizeIsFinite = ElementToClone->bSizeIsFinite;
  this->ElementPosition = ElementToClone->ElementPosition;
  this->SizePosition = ElementToClone->SizePosition;
  this->bValueIsSet = ElementToClone->bValueIsSet;
  this->DefaultIsSet = ElementToClone->DefaultIsSet;
  this->bLocked = ElementToClone->bLocked;
  return;
}

Assistant:

EbmlElement::EbmlElement(const EbmlElement & ElementToClone)
  :Size(ElementToClone.Size)
  ,DefaultSize(ElementToClone.DefaultSize)
  ,SizeLength(ElementToClone.SizeLength)
  ,bSizeIsFinite(ElementToClone.bSizeIsFinite)
  ,ElementPosition(ElementToClone.ElementPosition)
  ,SizePosition(ElementToClone.SizePosition)
  ,bValueIsSet(ElementToClone.bValueIsSet)
  ,DefaultIsSet(ElementToClone.DefaultIsSet)
  ,bLocked(ElementToClone.bLocked)
{
}